

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FederateState::receiveAny(FederateState *this,InterfaceHandle *hid)

{
  baseType *pbVar1;
  undefined4 uVar2;
  Time TVar3;
  undefined4 *in_RDX;
  Time TVar4;
  Time maxTime;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *end_point;
  baseType *pbVar5;
  handle elock;
  unique_lock<std::shared_mutex> local_40;
  
  TVar4.internalTimeCode = 0x7fffffffffffffff;
  local_40._M_device = (mutex_type *)(hid + 100);
  local_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  pbVar1 = *(baseType **)(hid + 0x44);
  maxTime.internalTimeCode = 0;
  for (pbVar5 = *(baseType **)(hid + 0x42); pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    TVar3 = EndpointInfo::firstMessageTime((EndpointInfo *)*pbVar5);
    if (TVar3.internalTimeCode < TVar4.internalTimeCode) {
      maxTime.internalTimeCode = *pbVar5;
      TVar4 = TVar3;
    }
  }
  if (maxTime.internalTimeCode != 0) {
    if (TVar4.internalTimeCode <= *(long *)(hid + 0x142)) {
      EndpointInfo::getMessage((EndpointInfo *)this,maxTime);
      if ((this->name)._M_dataplus._M_p == (pointer)0x0) {
        uVar2 = 0x9aac0f00;
      }
      else {
        uVar2 = *(undefined4 *)(maxTime.internalTimeCode + 4);
      }
      *in_RDX = uVar2;
      goto LAB_0031978b;
    }
    *in_RDX = 0x9aac0f00;
  }
  (this->name)._M_dataplus._M_p = (pointer)0x0;
LAB_0031978b:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> FederateState::receiveAny(InterfaceHandle& hid)
{
    Time earliest_time = Time::maxVal();
    EndpointInfo* endpointI = nullptr;
    auto elock = interfaceInformation.getEndpoints();
    // Find the end point with the earliest message time
    for (const auto& end_point : elock) {
        auto firstTime = end_point->firstMessageTime();
        if (firstTime < earliest_time) {
            earliest_time = firstTime;
            endpointI = end_point.get();
        }
    }
    if (endpointI == nullptr) {
        return nullptr;
    }
    // Return the message found and remove from the queue
    if (earliest_time <= time_granted) {
        auto result = endpointI->getMessage(time_granted);
        hid = (result) ? endpointI->id.handle : InterfaceHandle{};

        return result;
    }
    hid = InterfaceHandle();
    return nullptr;
}